

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# citylots_std.cpp
# Opt level: O0

void * parseObject(SymbolContext<char> *ctx)

{
  SymbolContext<char> *pSVar1;
  bool bVar2;
  int iVar3;
  JSONValue *pJVar4;
  JSONString *pJVar5;
  bool local_12a;
  allocator local_129;
  string local_128;
  JSONValue *local_108;
  JSONValue *street;
  string local_f8;
  allocator local_d1;
  string local_d0;
  JSONValue *local_b0;
  JSONValue *properties;
  string local_a0;
  allocator local_79;
  string local_78;
  byte local_55;
  byte local_42;
  allocator local_41;
  string local_40;
  SymbolContext<char> *local_20;
  JSONValue *v;
  SymbolContext<char> *ctx_local;
  
  v = (JSONValue *)ctx;
  iVar3 = Centaurus::SymbolContext<char>::count(ctx);
  if (iVar3 == 0) {
    ctx_local = (SymbolContext<char> *)0x0;
  }
  else {
    local_20 = (SymbolContext<char> *)
               Centaurus::SymbolContext<char>::value<JSONValue>((SymbolContext<char> *)v,1);
    bVar2 = JSONValue::is_object((JSONValue *)local_20);
    pSVar1 = local_20;
    local_42 = 0;
    local_55 = 0;
    local_12a = false;
    if (bVar2) {
      std::allocator<char>::allocator();
      local_42 = 1;
      std::__cxx11::string::string((string *)&local_40,"type",&local_41);
      local_55 = 1;
      local_12a = JSONValue::has_item((JSONValue *)pSVar1,&local_40);
    }
    if ((local_55 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_40);
    }
    if ((local_42 & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&local_41);
    }
    pSVar1 = local_20;
    if (local_12a != false) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_78,"type",&local_79);
      pJVar4 = JSONValue::operator[]((JSONValue *)pSVar1,&local_78);
      pJVar5 = JSONValue::str_abi_cxx11_(pJVar4);
      bVar2 = std::operator==(pJVar5,"Feature");
      std::__cxx11::string::~string((string *)&local_78);
      std::allocator<char>::~allocator((allocator<char> *)&local_79);
      pSVar1 = local_20;
      if (bVar2) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_a0,"properties",(allocator *)((long)&properties + 7));
        bVar2 = JSONValue::has_item((JSONValue *)pSVar1,&local_a0);
        std::__cxx11::string::~string((string *)&local_a0);
        std::allocator<char>::~allocator((allocator<char> *)((long)&properties + 7));
        pSVar1 = local_20;
        if (bVar2) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_d0,"properties",&local_d1);
          pJVar4 = JSONValue::operator[]((JSONValue *)pSVar1,&local_d0);
          std::__cxx11::string::~string((string *)&local_d0);
          std::allocator<char>::~allocator((allocator<char> *)&local_d1);
          local_b0 = pJVar4;
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_f8,"STREET",(allocator *)((long)&street + 7));
          bVar2 = JSONValue::has_item(pJVar4,&local_f8);
          std::__cxx11::string::~string((string *)&local_f8);
          std::allocator<char>::~allocator((allocator<char> *)((long)&street + 7));
          pJVar4 = local_b0;
          if (bVar2) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_128,"STREET",&local_129);
            pJVar4 = JSONValue::operator[](pJVar4,&local_128);
            std::__cxx11::string::~string((string *)&local_128);
            std::allocator<char>::~allocator((allocator<char> *)&local_129);
            local_108 = pJVar4;
            bVar2 = JSONValue::is_str(pJVar4);
            if (bVar2) {
              pJVar5 = JSONValue::str_abi_cxx11_(local_108);
              bVar2 = std::operator!=(pJVar5,"JEFFERSON");
              pSVar1 = local_20;
              if (bVar2) {
                if (local_20 != (SymbolContext<char> *)0x0) {
                  JSONValue::~JSONValue((JSONValue *)local_20);
                  operator_delete(pSVar1);
                }
                return (void *)0x0;
              }
            }
          }
        }
      }
    }
    ctx_local = local_20;
  }
  return ctx_local;
}

Assistant:

void *parseObject(const SymbolContext<char>& ctx)
{
    if (ctx.count() == 0) return nullptr;

    JSONValue *v = ctx.value<JSONValue>(1);

    if (v->is_object() && v->has_item("type"))
    {
        if (v->operator[]("type").str() == "Feature")
        {
            if (v->has_item("properties"))
            {
                const JSONValue& properties = v->operator[]("properties");

                if (properties.has_item("STREET"))
                {
                    const JSONValue& street = properties.operator[]("STREET");
                    if (street.is_str())
                    {
                        if (street.str() != "JEFFERSON")
                        {
                            delete v;
                            return nullptr;
                        }
                        else
                        {
                            // count++;
                        }
                    }
                    else
                    {
                        // count++;
                    }
                }
            }
        }
    }
    return v;
}